

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::TextureFilterMinmaxUtils::calcPixelSumValue
          (TextureFilterMinmaxUtils *this,RenderContext *context,GLuint textureId,IVec2 *textureSize
          ,GLenum format,GLenum type)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  GLuint GVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> textureData;
  IVec2 local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  local_28 = *(IVec2 *)textureSize->m_data;
  getDataFromTexture(&local_20,(TextureFilterMinmaxUtils *)context,context,textureId,&local_28,
                     format,type);
  if ((long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    GVar4 = 0;
    if (local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return 0;
    }
  }
  else {
    lVar2 = (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar3 = 0;
    GVar4 = 0;
    do {
      uVar1 = local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      GVar4 = (uVar1 >> 0x18) + (uVar1 & 0xff) + GVar4 +
              (uVar1 >> 0x10 & 0xff) + (uVar1 >> 8 & 0xff);
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  operator_delete(local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return GVar4;
}

Assistant:

glw::GLuint TextureFilterMinmaxUtils::calcPixelSumValue(const glu::RenderContext& context, glw::GLuint textureId,
														tcu::IVec2 textureSize, glw::GLenum format, glw::GLenum type)
{
	std::vector<glw::GLuint> textureData = getDataFromTexture(context, textureId, textureSize, format, type);

	glw::GLuint sum = 0;

	for (size_t texel = 0; texel < textureData.size(); ++texel)
	{
		tcu::RGBA rgba(textureData[texel]);
		sum += rgba.getRed();
		sum += rgba.getGreen();
		sum += rgba.getBlue();
		sum += rgba.getAlpha();
	}

	return sum;
}